

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void CDIVID(double *AR,double *AI,double *BR,double *BI,double INFINY,double *CR,double *CI)

{
  double dVar1;
  double dVar2;
  double D;
  double R;
  double INFIN;
  double *CI_local;
  double *CR_local;
  double INFINY_local;
  double *BI_local;
  double *BR_local;
  double *AI_local;
  double *AR_local;
  
  if ((((*BR != 0.0) || (NAN(*BR))) || (*BI != 0.0)) || (NAN(*BI))) {
    if (ABS(*BI) <= ABS(*BR)) {
      dVar1 = *BI / *BR;
      dVar2 = dVar1 * *BI + *BR;
      *CR = (*AI * dVar1 + *AR) / dVar2;
      *CI = (-*AR * dVar1 + *AI) / dVar2;
    }
    else {
      dVar1 = *BR / *BI;
      dVar2 = dVar1 * *BR + *BI;
      *CR = (*AR * dVar1 + *AI) / dVar2;
      *CI = (*AI * dVar1 + -*AR) / dVar2;
    }
  }
  else {
    *CI = INFINY;
    *CR = INFINY;
  }
  return;
}

Assistant:

static void CDIVID(double *AR, double *AI, double *BR, double *BI, double INFINY, double *CR, double *CI) {
	// C COMPLEX DIVISION C = A/B, AVOIDING OVERFLOW.
	double INFIN,R,D;
	if ( !(*BR != 0.0 || *BI != 0.0) ) {
		INFIN = INFINY;
		*CR = *CI = INFIN;
	}
	else {
		if (fabs(*BR) < fabs(*BI)) {
			R = *BR / *BI;
			D = *BI + R * *BR;
			*CR = (*AR*R + *AI) / D;
			*CI = (*AI*R - *AR) / D;
		}
		else {
			R = *BI / *BR;
			D = *BR + R * *BI;
			*CR = (*AR + *AI*R) / D;
			*CI = (*AI - *AR*R) / D;
		}
	}

}